

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxGetClass::Emit(FxGetClass *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint uVar2;
  undefined4 extraout_var;
  ExpEmit EVar3;
  
  uVar1 = (*this->Self->_vptr_FxExpression[9])();
  if ((CONCAT44(extraout_var,uVar1) & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (uVar1 >> 0x10 & 3),uVar1 & 0xffff,uVar1 >> 0x18);
  }
  uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  VMFunctionBuilder::Emit(build,0xb,uVar2 & 0xffff,(VM_SHALF)uVar1);
  EVar3._0_4_ = uVar2 & 0xffff | 0x1030000;
  EVar3.Konst = false;
  EVar3.Fixed = false;
  EVar3.Final = false;
  EVar3.Target = false;
  return EVar3;
}

Assistant:

ExpEmit FxGetClass::Emit(VMFunctionBuilder *build)
{
	ExpEmit op = Self->Emit(build);
	op.Free(build);
	ExpEmit to(build, REGT_POINTER);
	build->Emit(OP_META, to.RegNum, op.RegNum);
	return to;
}